

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack6_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x3f;
  out[1] = *in >> 6 & 0x3f;
  out[2] = *in >> 0xc & 0x3f;
  out[3] = *in >> 0x12 & 0x3f;
  out[4] = *in >> 0x18 & 0x3f;
  puVar1 = out + 5;
  *puVar1 = *in >> 0x1e;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0xf) << 2 | *puVar1;
  out[6] = *puVar2 >> 4 & 0x3f;
  out[7] = *puVar2 >> 10 & 0x3f;
  out[8] = *puVar2 >> 0x10 & 0x3f;
  out[9] = *puVar2 >> 0x16 & 0x3f;
  puVar1 = out + 10;
  *puVar1 = *puVar2 >> 0x1c;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 3) << 4 | *puVar1;
  out[0xb] = *puVar2 >> 2 & 0x3f;
  out[0xc] = *puVar2 >> 8 & 0x3f;
  out[0xd] = *puVar2 >> 0xe & 0x3f;
  out[0xe] = *puVar2 >> 0x14 & 0x3f;
  out[0xf] = *puVar2 >> 0x1a;
  puVar1 = in + 3;
  out[0x10] = *puVar1 & 0x3f;
  out[0x11] = *puVar1 >> 6 & 0x3f;
  out[0x12] = *puVar1 >> 0xc & 0x3f;
  out[0x13] = *puVar1 >> 0x12 & 0x3f;
  out[0x14] = *puVar1 >> 0x18 & 0x3f;
  puVar2 = out + 0x15;
  *puVar2 = *puVar1 >> 0x1e;
  puVar1 = in + 4;
  *puVar2 = (*puVar1 & 0xf) << 2 | *puVar2;
  out[0x16] = *puVar1 >> 4 & 0x3f;
  out[0x17] = *puVar1 >> 10 & 0x3f;
  out[0x18] = *puVar1 >> 0x10 & 0x3f;
  out[0x19] = *puVar1 >> 0x16 & 0x3f;
  puVar2 = out + 0x1a;
  *puVar2 = *puVar1 >> 0x1c;
  puVar1 = in + 5;
  *puVar2 = (*puVar1 & 3) << 4 | *puVar2;
  out[0x1b] = *puVar1 >> 2 & 0x3f;
  out[0x1c] = *puVar1 >> 8 & 0x3f;
  out[0x1d] = *puVar1 >> 0xe & 0x3f;
  out[0x1e] = *puVar1 >> 0x14 & 0x3f;
  out[0x1f] = *puVar1 >> 0x1a;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack6_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;
  *out = ((*in) >> 16) % (1U << 6);
  out++;
  *out = ((*in) >> 22) % (1U << 6);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 2)) << (6 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 6);
  out++;
  *out = ((*in) >> 8) % (1U << 6);
  out++;
  *out = ((*in) >> 14) % (1U << 6);
  out++;
  *out = ((*in) >> 20) % (1U << 6);
  out++;
  *out = ((*in) >> 26);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;
  *out = ((*in) >> 16) % (1U << 6);
  out++;
  *out = ((*in) >> 22) % (1U << 6);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 2)) << (6 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 6);
  out++;
  *out = ((*in) >> 8) % (1U << 6);
  out++;
  *out = ((*in) >> 14) % (1U << 6);
  out++;
  *out = ((*in) >> 20) % (1U << 6);
  out++;
  *out = ((*in) >> 26);
  ++in;
  out++;

  return in;
}